

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsbr_gtest_utils.hpp
# Opt level: O1

void unodb::test::QSBRTestBase::qsbr_deallocate(void *ptr)

{
  __int_type _Var1;
  bool bVar2;
  qsbr *pqVar3;
  char *pcVar4;
  char *in_R9;
  uint uVar5;
  long in_FS_OFFSET;
  debug_callback local_a8;
  unsigned_long local_80;
  size_t current_interval_total_dealloc_size_before;
  AssertionResult gtest_ar_;
  bool previous_interval_empty_after;
  undefined7 uStack_5f;
  AssertionResult gtest_ar;
  unsigned_long uStack_38;
  bool current_interval_empty_before;
  size_t current_interval_total_dealloc_size_after;
  AssertHelper AStack_28;
  bool previous_interval_empty_before;
  bool local_19 [8];
  bool current_interval_empty_after;
  
  qsbr_per_thread::current_thread_instance::__tls_init();
  local_80 = *(unsigned_long *)(*(long *)(in_FS_OFFSET + -0x10) + 0x58);
  qsbr_per_thread::current_thread_instance::__tls_init();
  current_interval_total_dealloc_size_after._7_1_ =
       *(long *)(*(long *)(in_FS_OFFSET + -0x10) + 0x20) ==
       *(long *)(*(long *)(in_FS_OFFSET + -0x10) + 0x28);
  qsbr_per_thread::current_thread_instance::__tls_init();
  qsbr_per_thread::current_thread_instance::__tls_init();
  local_a8.super__Function_base._M_functor._8_8_ = 0;
  local_a8.super__Function_base._M_functor._M_unused._M_object = check_ptr_on_qsbr_dealloc;
  local_a8._M_invoker =
       std::_Function_handler<void_(const_void_*),_void_(*)(const_void_*)_noexcept>::_M_invoke;
  local_a8.super__Function_base._M_manager =
       std::_Function_handler<void_(const_void_*),_void_(*)(const_void_*)_noexcept>::_M_manager;
  qsbr_per_thread::on_next_epoch_deallocate
            (*(qsbr_per_thread **)(in_FS_OFFSET + -0x10),ptr,1,&local_a8);
  if (local_a8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_a8.super__Function_base._M_manager)
              ((_Any_data *)&local_a8,(_Any_data *)&local_a8,__destroy_functor);
  }
  qsbr_per_thread::current_thread_instance::__tls_init();
  uStack_38 = *(unsigned_long *)(*(long *)(in_FS_OFFSET + -0x10) + 0x58);
  qsbr_per_thread::current_thread_instance::__tls_init();
  local_19[0] = *(long *)(*(long *)(in_FS_OFFSET + -0x10) + 0x38) ==
                *(long *)(*(long *)(in_FS_OFFSET + -0x10) + 0x40);
  pqVar3 = qsbr::instance();
  _Var1 = (pqVar3->state).super___atomic_base<unsigned_long>._M_i;
  uVar5 = (uint)(_Var1 >> 0x20) & 0x3fffffff;
  if (uVar5 < ((uint)_Var1 & 0x3fffffff)) {
    __assert_fail("threads_in_previous <= thread_count",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./qsbr.hpp"
                  ,0x19b,"static void unodb::qsbr_state::assert_invariants(type)");
  }
  current_interval_total_dealloc_size_before._0_4_ =
       CONCAT31(current_interval_total_dealloc_size_before._1_3_,uStack_38 == 0);
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&previous_interval_empty_after,"(current_interval_empty_after)",
             "((current_interval_total_dealloc_size_after == 0))",local_19,
             (bool *)&current_interval_total_dealloc_size_before);
  if (previous_interval_empty_after == false) {
    testing::Message::Message((Message *)&current_interval_total_dealloc_size_before);
    if (gtest_ar._0_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&stack0xffffffffffffffd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/qsbr_gtest_utils.hpp"
               ,0xd3,pcVar4);
    testing::internal::AssertHelper::operator=
              (&stack0xffffffffffffffd8,(Message *)&current_interval_total_dealloc_size_before);
    testing::internal::AssertHelper::~AssertHelper(&stack0xffffffffffffffd8);
    if ((long *)CONCAT44(current_interval_total_dealloc_size_before._4_4_,
                         (undefined4)current_interval_total_dealloc_size_before) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(current_interval_total_dealloc_size_before._4_4_,
                                     (undefined4)current_interval_total_dealloc_size_before) + 8))()
      ;
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  if (uVar5 < 2) {
    bVar2 = uStack_38 == 0 || local_80 == uStack_38;
    current_interval_total_dealloc_size_before._0_4_ =
         CONCAT31(current_interval_total_dealloc_size_before._1_3_,bVar2);
    gtest_ar_.success_ = false;
    gtest_ar_._1_7_ = 0;
    if (bVar2) goto LAB_0010dced;
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&previous_interval_empty_after,
               (internal *)&current_interval_total_dealloc_size_before,
               (AssertionResult *)
               "current_interval_total_dealloc_size_before == current_interval_total_dealloc_size_after || current_interval_total_dealloc_size_after == 0"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/qsbr_gtest_utils.hpp"
               ,0xd7,(char *)CONCAT71(uStack_5f,previous_interval_empty_after));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)&stack0xffffffffffffffd8);
  }
  else {
    current_interval_total_dealloc_size_before._0_4_ = 0;
    testing::internal::CmpHelperGT<unsigned_long,int>
              ((internal *)&previous_interval_empty_after,
               "(current_interval_total_dealloc_size_after)","(0)",&stack0xffffffffffffffc8,
               (int *)&current_interval_total_dealloc_size_before);
    if (previous_interval_empty_after == false) {
      testing::Message::Message((Message *)&current_interval_total_dealloc_size_before);
      if (gtest_ar._0_8_ == 0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&stack0xffffffffffffffd8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/qsbr_gtest_utils.hpp"
                 ,0xd9,pcVar4);
      testing::internal::AssertHelper::operator=
                (&stack0xffffffffffffffd8,(Message *)&current_interval_total_dealloc_size_before);
      testing::internal::AssertHelper::~AssertHelper(&stack0xffffffffffffffd8);
      if ((long *)CONCAT44(current_interval_total_dealloc_size_before._4_4_,
                           (undefined4)current_interval_total_dealloc_size_before) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(current_interval_total_dealloc_size_before._4_4_,
                                       (undefined4)current_interval_total_dealloc_size_before) + 8))
                  ();
      }
    }
    if (gtest_ar._0_8_ != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&gtest_ar,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   gtest_ar._0_8_);
    }
    bVar2 = uStack_38 == local_80 + 1 || uStack_38 == 1;
    current_interval_total_dealloc_size_before._0_4_ =
         CONCAT31(current_interval_total_dealloc_size_before._1_3_,bVar2);
    gtest_ar_.success_ = false;
    gtest_ar_._1_7_ = 0;
    if (bVar2) goto LAB_0010dced;
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&previous_interval_empty_after,
               (internal *)&current_interval_total_dealloc_size_before,
               (AssertionResult *)
               "current_interval_total_dealloc_size_after == 1 || (current_interval_total_dealloc_size_after == current_interval_total_dealloc_size_before + 1)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/qsbr_gtest_utils.hpp"
               ,0xdc,(char *)CONCAT71(uStack_5f,previous_interval_empty_after));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)&stack0xffffffffffffffd8);
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
  if ((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)CONCAT71(uStack_5f,previous_interval_empty_after) != &gtest_ar.message_) {
    operator_delete((undefined1 *)CONCAT71(uStack_5f,previous_interval_empty_after),
                    (long)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 1);
  }
  if (AStack_28.data_ != (AssertHelperData *)0x0) {
    (**(code **)(*(long *)AStack_28.data_ + 8))();
  }
LAB_0010dced:
  if (gtest_ar_._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 gtest_ar_._0_8_);
  }
  return;
}

Assistant:

static void qsbr_deallocate(void *ptr) {
#ifdef UNODB_DETAIL_WITH_STATS
    const auto current_interval_total_dealloc_size_before =
        unodb::this_thread().get_current_interval_total_dealloc_size();
#endif  // UNODB_DETAIL_WITH_STATS
    const auto previous_interval_empty_before =
        unodb::this_thread().previous_interval_requests_empty();
    const auto current_interval_empty_before =
        unodb::this_thread().current_interval_requests_empty();

    try {
      unodb::this_thread().on_next_epoch_deallocate(ptr
#ifdef UNODB_DETAIL_WITH_STATS
                                                    ,
                                                    1
#endif
#ifndef NDEBUG
                                                    ,
                                                    check_ptr_on_qsbr_dealloc
#endif
      );
    } catch (...) {
      const auto previous_interval_empty_after =
          unodb::this_thread().previous_interval_requests_empty();
      const auto current_interval_empty_after =
          unodb::this_thread().current_interval_requests_empty();
#ifdef UNODB_DETAIL_WITH_STATS
      const auto current_interval_total_dealloc_size_after =
          unodb::this_thread().get_current_interval_total_dealloc_size();
      UNODB_EXPECT_EQ(current_interval_total_dealloc_size_before,
                      current_interval_total_dealloc_size_after);
#endif  // UNODB_DETAIL_WITH_STATS
      UNODB_EXPECT_EQ(previous_interval_empty_before,
                      previous_interval_empty_after);
      UNODB_EXPECT_EQ(current_interval_empty_before,
                      current_interval_empty_after);
      throw;
    }

#ifdef UNODB_DETAIL_WITH_STATS
    const auto current_interval_total_dealloc_size_after =
        unodb::this_thread().get_current_interval_total_dealloc_size();
    const auto current_interval_empty_after =
        unodb::this_thread().current_interval_requests_empty();
    const auto single_thread_mode =
        qsbr_state::single_thread_mode(qsbr::instance().get_state());
    UNODB_EXPECT_EQ(current_interval_empty_after,
                    (current_interval_total_dealloc_size_after == 0));
    if (single_thread_mode) {
      UNODB_EXPECT_TRUE(current_interval_total_dealloc_size_before ==
                            current_interval_total_dealloc_size_after ||
                        current_interval_total_dealloc_size_after == 0);
    } else {
      UNODB_EXPECT_GT(current_interval_total_dealloc_size_after, 0);
      UNODB_EXPECT_TRUE(current_interval_total_dealloc_size_after == 1 ||
                        (current_interval_total_dealloc_size_after ==
                         current_interval_total_dealloc_size_before + 1));
    }
#endif  // UNODB_DETAIL_WITH_STATS
  }